

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImVector<unsigned_int> *pIVar1;
  int iVar2;
  int iVar3;
  ImGuiTable *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindowStackData *pIVar6;
  ImGuiTabBar *pIVar7;
  ImGuiMultiSelectTempData *pIVar8;
  char *pcVar9;
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  char *pcVar12;
  ImGuiID IVar13;
  
  pIVar10 = GImGui;
  pIVar4 = GImGui->CurrentTable;
  while (pIVar4 != (ImGuiTable *)0x0) {
    if ((pIVar4->OuterWindow != pIVar10->CurrentWindow) &&
       (pIVar4->InnerWindow != pIVar10->CurrentWindow)) break;
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTable() in \'%s\'",
                      pIVar4->OuterWindow->Name);
    }
    EndTable();
    pIVar4 = pIVar10->CurrentTable;
  }
  pIVar5 = pIVar10->CurrentWindow;
  iVar2 = (pIVar10->CurrentWindowStack).Size;
  pIVar6 = (pIVar10->CurrentWindowStack).Data;
  pIVar7 = pIVar10->CurrentTabBar;
  while (pIVar7 != (ImGuiTabBar *)0x0) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar5->Name);
    }
    EndTabBar();
    pIVar7 = pIVar10->CurrentTabBar;
  }
  pIVar8 = pIVar10->CurrentMultiSelect;
  while ((pIVar8 != (ImGuiMultiSelectTempData *)0x0 && (pIVar8->Storage->Window == pIVar5))) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndMultiSelect() in \'%s\'",pIVar5->Name);
    }
    EndMultiSelect();
    pIVar8 = pIVar10->CurrentMultiSelect;
  }
  iVar3 = (pIVar5->DC).TreeDepth;
  while (0 < iVar3) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar5->Name);
    }
    TreePop();
    iVar3 = (pIVar5->DC).TreeDepth;
  }
  if ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfGroupStack < (pIVar10->GroupStack).Size)
  {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar5->Name);
      }
      EndGroup();
    } while ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfGroupStack <
             (pIVar10->GroupStack).Size);
  }
  iVar3 = (pIVar5->IDStack).Size;
  while (1 < iVar3) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar5->Name);
    }
    pIVar1 = &GImGui->CurrentWindow->IDStack;
    pIVar1->Size = pIVar1->Size + -1;
    iVar3 = (pIVar5->IDStack).Size;
  }
  if (pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfDisabledStack < pIVar10->DisabledStackSize) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndDisabled() in \'%s\'",pIVar5->Name);
      }
      pIVar11 = GImGui;
      if ((pIVar10->CurrentItemFlags & 0x400) == 0) {
        GImGui->DisabledStackSize = GImGui->DisabledStackSize + -1;
        iVar3 = (pIVar11->ItemFlagsStack).Size;
        (pIVar11->ItemFlagsStack).Size = iVar3 + -1;
        pIVar11->CurrentItemFlags = (pIVar11->ItemFlagsStack).Data[(long)iVar3 + -2];
        (pIVar11->Style).Alpha = pIVar11->DisabledAlphaBackup * (pIVar11->Style).DisabledAlpha;
        (pIVar10->CurrentWindowStack).Data[(long)(pIVar10->CurrentWindowStack).Size + -1].
        DisabledOverrideReenable = false;
      }
      else {
        EndDisabled();
      }
    } while (pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfDisabledStack <
             pIVar10->DisabledStackSize);
  }
  while (iVar3 = (pIVar10->ColorStack).Size,
        pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfColorStack < iVar3) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      pcVar9 = pIVar5->Name;
      pcVar12 = GetStyleColorName((pIVar10->ColorStack).Data[(long)iVar3 + -1].Col);
      (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s",
                      pcVar9,pcVar12);
    }
    PopStyleColor(1);
  }
  if ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfItemFlagsStack <
      (pIVar10->ItemFlagsStack).Size) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopItemFlag() in \'%s\'",pIVar5->Name);
      }
      pIVar11 = GImGui;
      iVar3 = (GImGui->ItemFlagsStack).Size;
      (GImGui->ItemFlagsStack).Size = iVar3 + -1;
      pIVar11->CurrentItemFlags = (pIVar11->ItemFlagsStack).Data[(long)iVar3 + -2];
    } while ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfItemFlagsStack <
             (pIVar10->ItemFlagsStack).Size);
  }
  if ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfStyleVarStack <
      (pIVar10->StyleVarStack).Size) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",pIVar5->Name);
      }
      PopStyleVar(1);
    } while ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfStyleVarStack <
             (pIVar10->StyleVarStack).Size);
  }
  if ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfFontStack < (pIVar10->FontStack).Size) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopFont() in \'%s\'",pIVar5->Name);
      }
      PopFont();
    } while ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfFontStack <
             (pIVar10->FontStack).Size);
  }
  if (pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfFocusScopeStack + 1 <
      (pIVar10->FocusScopeStack).Size) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",pIVar5->Name);
      }
      pIVar11 = GImGui;
      iVar3 = (GImGui->FocusScopeStack).Size;
      if ((long)iVar3 != 0) {
        (GImGui->FocusScopeStack).Size = iVar3 + -1;
        if (iVar3 + -1 == 0) {
          IVar13 = 0;
        }
        else {
          IVar13 = (pIVar11->FocusScopeStack).Data[(long)iVar3 + -2].ID;
        }
        pIVar11->CurrentFocusScopeId = IVar13;
      }
    } while (pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfFocusScopeStack + 1 <
             (pIVar10->FocusScopeStack).Size);
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    ImGuiContext& g = *GImGui;
    while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
        EndTable();
    }

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackSizes* stack_sizes = &g.CurrentWindowStack.back().StackSizesOnBegin;
    IM_ASSERT(window != NULL);
    while (g.CurrentTabBar != NULL) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
        EndTabBar();
    }
    while (g.CurrentMultiSelect != NULL && g.CurrentMultiSelect->Storage->Window == window)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndMultiSelect() in '%s'", window->Name);
        EndMultiSelect();
    }
    while (window->DC.TreeDepth > 0)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
        TreePop();
    }
    while (g.GroupStack.Size > stack_sizes->SizeOfGroupStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
        EndGroup();
    }
    while (window->IDStack.Size > 1)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
        PopID();
    }
    while (g.DisabledStackSize > stack_sizes->SizeOfDisabledStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndDisabled() in '%s'", window->Name);
        if (g.CurrentItemFlags & ImGuiItemFlags_Disabled)
            EndDisabled();
        else
        {
            EndDisabledOverrideReenable();
            g.CurrentWindowStack.back().DisabledOverrideReenable = false;
        }
    }
    while (g.ColorStack.Size > stack_sizes->SizeOfColorStack)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
        PopStyleColor();
    }
    while (g.ItemFlagsStack.Size > stack_sizes->SizeOfItemFlagsStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopItemFlag() in '%s'", window->Name);
        PopItemFlag();
    }
    while (g.StyleVarStack.Size > stack_sizes->SizeOfStyleVarStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
        PopStyleVar();
    }
    while (g.FontStack.Size > stack_sizes->SizeOfFontStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopFont() in '%s'", window->Name);
        PopFont();
    }
    while (g.FocusScopeStack.Size > stack_sizes->SizeOfFocusScopeStack + 1) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
        PopFocusScope();
    }
}